

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_shrink_buf(ikcpcb *kcp)

{
  IQUEUEHEAD *pIVar1;
  IKCPSEG *seg;
  IQUEUEHEAD *p;
  ikcpcb *kcp_local;
  
  pIVar1 = (kcp->snd_buf).next;
  if (pIVar1 == &kcp->snd_buf) {
    kcp->snd_una = kcp->snd_nxt;
  }
  else {
    kcp->snd_una = *(IUINT32 *)((long)&pIVar1[2].next + 4);
  }
  return;
}

Assistant:

static void ikcp_shrink_buf(ikcpcb *kcp)
{
	struct IQUEUEHEAD *p = kcp->snd_buf.next;
	if (p != &kcp->snd_buf) {
		IKCPSEG *seg = iqueue_entry(p, IKCPSEG, node);
		kcp->snd_una = seg->sn;
	}	else {
		kcp->snd_una = kcp->snd_nxt;
	}
}